

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O1

void FAudioVoice_GetOutputMatrix
               (FAudioVoice *voice,FAudioVoice *pDestinationVoice,uint32_t SourceChannels,
               uint32_t DestinationChannels,float *pLevelMatrix)

{
  uint uVar1;
  FAudioSendDescriptor *pFVar2;
  FAudioVoice *pFVar3;
  long lVar4;
  FAudioVoice **ppFVar5;
  bool bVar6;
  
  FAudio_PlatformLockMutex(voice->sendLock);
  uVar1 = (voice->sends).SendCount;
  bVar6 = uVar1 != 0;
  if (bVar6) {
    pFVar2 = (voice->sends).pSends;
    if (pFVar2->pOutputVoice == pDestinationVoice) {
      lVar4 = 0;
    }
    else {
      lVar4 = 0;
      ppFVar5 = &pFVar2[1].pOutputVoice;
      do {
        if (uVar1 - 1 == (int)lVar4) goto LAB_0011601e;
        lVar4 = lVar4 + 1;
        pFVar3 = *ppFVar5;
        ppFVar5 = (FAudioVoice **)((long)ppFVar5 + 0xc);
      } while (pFVar3 != pDestinationVoice);
      bVar6 = (uint)lVar4 < uVar1;
    }
    if (bVar6) {
      SDL_memcpy(pLevelMatrix,voice->sendCoefficients[lVar4],
                 (ulong)DestinationChannels * (ulong)SourceChannels * 4);
    }
  }
LAB_0011601e:
  FAudio_PlatformUnlockMutex(voice->sendLock);
  return;
}

Assistant:

void FAudioVoice_GetOutputMatrix(
	FAudioVoice *voice,
	FAudioVoice *pDestinationVoice,
	uint32_t SourceChannels,
	uint32_t DestinationChannels,
	float *pLevelMatrix
) {
	uint32_t i;

	LOG_API_ENTER(voice->audio)
	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	/* Find the send index */
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		if (pDestinationVoice == voice->sends.pSends[i].pOutputVoice)
		{
			break;
		}
	}
	if (i >= voice->sends.SendCount)
	{
		LOG_ERROR(
			voice->audio,
			"Destination not attached to source: %p %p",
			(void*) voice,
			(void*) pDestinationVoice
		)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return;
	}

	/* Verify the Source/Destination channel count */
	if (voice->type == FAUDIO_VOICE_SOURCE)
	{
		FAudio_assert(SourceChannels == voice->src.format->nChannels);
	}
	else
	{
		FAudio_assert(SourceChannels == voice->mix.inputChannels);
	}
	if (pDestinationVoice->type == FAUDIO_VOICE_MASTER)
	{
		FAudio_assert(DestinationChannels == pDestinationVoice->master.inputChannels);
	}
	else
	{
		FAudio_assert(DestinationChannels == pDestinationVoice->mix.inputChannels);
	}

	/* Get the matrix values, finally */
	FAudio_memcpy(
		pLevelMatrix,
		voice->sendCoefficients[i],
		sizeof(float) * SourceChannels * DestinationChannels
	);

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
}